

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exactfloat.cc
# Opt level: O0

int BN_ext_count_low_zero_bits(BIGNUM *bn)

{
  StorageElement *pSVar1;
  int iVar2;
  int iVar3;
  pointer puVar4;
  size_type sVar5;
  ostream *poVar6;
  iterator puVar7;
  byte local_169;
  uchar c;
  iterator __end1;
  iterator __begin1;
  FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> *__range1;
  int count;
  S2LogMessageVoidify local_135 [20];
  allocator<unsigned_char> local_121;
  undefined1 local_120 [8];
  FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> bytes;
  BIGNUM *bn_local;
  
  bytes.storage_.data_ = (StorageElement *)bn;
  iVar2 = BN_num_bits((BIGNUM *)bn);
  iVar3 = iVar2 + 7;
  if (iVar2 + 7 < 0) {
    iVar3 = iVar2 + 0xe;
  }
  std::allocator<unsigned_char>::allocator(&local_121);
  absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
  FixedArray((FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> *)
             local_120,(long)(iVar3 >> 3),&local_121);
  std::allocator<unsigned_char>::~allocator(&local_121);
  pSVar1 = bytes.storage_.data_;
  puVar4 = absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
           data((FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> *
                )local_120);
  sVar5 = absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
          size((FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> *)
               local_120);
  iVar3 = BN_bn2lebinpad(pSVar1,puVar4,sVar5 & 0xffffffff);
  sVar5 = absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
          size((FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> *)
               local_120);
  if ((long)iVar3 != sVar5) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&count,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/math/exactfloat/exactfloat.cc"
               ,0x8b,kFatal,(ostream *)&std::cerr);
    poVar6 = S2LogMessage::stream((S2LogMessage *)&count);
    poVar6 = std::operator<<(poVar6,
                             "Check failed: (BN_bn2lebinpad(bn, bytes.data(), bytes.size())) == (bytes.size()) "
                            );
    S2LogMessageVoidify::operator&(local_135,poVar6);
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&count);
  }
  __range1._0_4_ = 0;
  __end1 = absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
           begin((FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>
                  *)local_120);
  puVar7 = absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
           end((FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> *)
               local_120);
  for (; __end1 != puVar7; __end1 = __end1 + 1) {
    local_169 = *__end1;
    if (local_169 != 0) goto LAB_00526b25;
    __range1._0_4_ = (int)__range1 + 8;
  }
LAB_00526b6f:
  absl::FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_>::
  ~FixedArray((FixedArray<unsigned_char,_18446744073709551615UL,_std::allocator<unsigned_char>_> *)
              local_120);
  return (int)__range1;
LAB_00526b25:
  for (; (local_169 & 1) == 0; local_169 = (byte)((int)(uint)local_169 >> 1)) {
    __range1._0_4_ = (int)__range1 + 1;
  }
  goto LAB_00526b6f;
}

Assistant:

static int BN_ext_count_low_zero_bits(const BIGNUM* bn) {
  // In OpenSSL >= 1.1, BIGNUM is an opaque type, so d and top
  // cannot be accessed.  The bytes must be copied out at a ~25%
  // performance penalty.
  absl::FixedArray<unsigned char> bytes(BN_num_bytes(bn));
  // "le" indicates little endian.
  S2_CHECK_EQ(BN_bn2lebinpad(bn, bytes.data(), bytes.size()), bytes.size());

  int count = 0;
  for (unsigned char c : bytes) {
    if (c == 0) {
      count += 8;
    } else {
      for (; (c & 1) == 0; c >>= 1) {
        ++count;
      }
      break;
    }
  }
  return count;
}